

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int GetCopyDistance(int distance_symbol,VP8LBitReader *br)

{
  int iVar1;
  int n_bits;
  uint32_t uVar2;
  uint in_EDI;
  int offset;
  int extra_bits;
  undefined4 local_4;
  
  if ((int)in_EDI < 4) {
    local_4 = in_EDI + 1;
  }
  else {
    iVar1 = (int)(in_EDI - 2) >> 1;
    n_bits = (in_EDI & 1) + 2 << ((byte)iVar1 & 0x1f);
    uVar2 = VP8LReadBits((VP8LBitReader *)CONCAT44(iVar1,n_bits),n_bits);
    local_4 = n_bits + uVar2 + 1;
  }
  return local_4;
}

Assistant:

static WEBP_INLINE int GetCopyDistance(int distance_symbol,
                                       VP8LBitReader* const br) {
  int extra_bits, offset;
  if (distance_symbol < 4) {
    return distance_symbol + 1;
  }
  extra_bits = (distance_symbol - 2) >> 1;
  offset = (2 + (distance_symbol & 1)) << extra_bits;
  return offset + VP8LReadBits(br, extra_bits) + 1;
}